

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3GetInt32(char *zNum,int *pValue)

{
  char cVar1;
  ulong uVar2;
  long lVar3;
  byte *pbVar4;
  byte *pbVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  
  cVar1 = *zNum;
  if (cVar1 == '-') {
    zNum = zNum + 1;
    lVar3 = -1;
  }
  else {
    if (cVar1 == '0') {
      if (((byte)(zNum[1] | 0x20U) == 0x78) && ((""[(byte)zNum[2]] & 8) != 0)) {
        pbVar4 = (byte *)(zNum + 2);
        do {
          pbVar5 = pbVar4;
          pbVar4 = pbVar5 + 1;
        } while (*pbVar5 == 0x30);
        uVar2 = (ulong)*pbVar5;
        bVar10 = true;
        uVar6 = 0;
        if ((""[uVar2] & 8) != 0) {
          uVar9 = 0;
          uVar6 = 0;
          do {
            uVar6 = (uint)(((char)((char)uVar2 * '\x02') >> 7 & 9U) + (char)uVar2 & 0xf) |
                    uVar6 << 4;
            uVar2 = (ulong)(pbVar5 + 1)[uVar9];
            if (6 < uVar9) break;
            uVar9 = uVar9 + 1;
          } while ((""[uVar2] & 8) != 0);
          bVar10 = (""[uVar2] & 8) == 0;
        }
        if ((int)uVar6 < 0) {
          return 0;
        }
        if (!bVar10) {
          return 0;
        }
        goto LAB_00168b73;
      }
    }
    else if (cVar1 == '+') {
      zNum = zNum + 1;
    }
    lVar3 = 0;
  }
  if ((ulong)(byte)*zNum - 0x3a < 0xfffffffffffffff6) {
    return 0;
  }
  do {
    pbVar4 = (byte *)zNum;
    zNum = (char *)(pbVar4 + 1);
  } while (*pbVar4 == 0x30);
  lVar7 = 0;
  lVar8 = 0;
  do {
    if (9 < (byte)(pbVar4[lVar7] - 0x30)) goto LAB_00168b52;
    lVar8 = (ulong)(pbVar4[lVar7] & 0xf) + lVar8 * 10;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0xb);
  lVar7 = 0xb;
LAB_00168b52:
  if (10 < (uint)lVar7) {
    return 0;
  }
  if (0x7fffffff < lVar3 + lVar8) {
    return 0;
  }
  uVar6 = -(uint)lVar8;
  if (cVar1 != '-') {
    uVar6 = (uint)lVar8;
  }
LAB_00168b73:
  *pValue = uVar6;
  return 1;
}

Assistant:

SQLITE_PRIVATE int sqlite3GetInt32(const char *zNum, int *pValue){
  sqlite_int64 v = 0;
  int i, c;
  int neg = 0;
  if( zNum[0]=='-' ){
    neg = 1;
    zNum++;
  }else if( zNum[0]=='+' ){
    zNum++;
  }
#ifndef SQLITE_OMIT_HEX_INTEGER
  else if( zNum[0]=='0'
        && (zNum[1]=='x' || zNum[1]=='X')
        && sqlite3Isxdigit(zNum[2])
  ){
    u32 u = 0;
    zNum += 2;
    while( zNum[0]=='0' ) zNum++;
    for(i=0; sqlite3Isxdigit(zNum[i]) && i<8; i++){
      u = u*16 + sqlite3HexToInt(zNum[i]);
    }
    if( (u&0x80000000)==0 && sqlite3Isxdigit(zNum[i])==0 ){
      memcpy(pValue, &u, 4);
      return 1;
    }else{
      return 0;
    }
  }
#endif
  if( !sqlite3Isdigit(zNum[0]) ) return 0;
  while( zNum[0]=='0' ) zNum++;
  for(i=0; i<11 && (c = zNum[i] - '0')>=0 && c<=9; i++){
    v = v*10 + c;
  }

  /* The longest decimal representation of a 32 bit integer is 10 digits:
  **
  **             1234567890
  **     2^31 -> 2147483648
  */
  testcase( i==10 );
  if( i>10 ){
    return 0;
  }
  testcase( v-neg==2147483647 );
  if( v-neg>2147483647 ){
    return 0;
  }
  if( neg ){
    v = -v;
  }
  *pValue = (int)v;
  return 1;
}